

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void random_field_element_magnitude(secp256k1_fe *fe)

{
  uint32_t uVar1;
  secp256k1_fe zero;
  
  uVar1 = secp256k1_testrand_int(9);
  secp256k1_fe_normalize(fe);
  if (uVar1 != 0) {
    secp256k1_fe_clear(&zero);
    secp256k1_fe_negate_unchecked(&zero,&zero,0);
    secp256k1_fe_mul_int_unchecked(&zero,uVar1 - 1);
    secp256k1_fe_add(fe,&zero);
    if (fe->magnitude != uVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x68,"test condition failed: fe->magnitude == n");
      abort();
    }
  }
  return;
}

Assistant:

static void random_field_element_magnitude(secp256k1_fe *fe) {
    secp256k1_fe zero;
    int n = secp256k1_testrand_int(9);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_clear(&zero);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}